

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall wabt::SharedValidator::EndModule(SharedValidator *this)

{
  pointer pVVar1;
  Result RVar2;
  Enum EVar3;
  pointer rhs;
  Var func_var;
  Var local_c0;
  Var local_78;
  
  pVVar1 = (this->check_declared_funcs_).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  EVar3 = Ok;
  for (rhs = (this->check_declared_funcs_).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>
             ._M_impl.super__Vector_impl_data._M_start; rhs != pVVar1; rhs = rhs + 1) {
    Var::Var(&local_78,rhs);
    Var::Var(&local_c0,&local_78);
    RVar2 = CheckDeclaredFunc(this,&local_c0);
    EVar3 = (Enum)(RVar2.enum_ == Error || EVar3 != Ok);
    Var::~Var(&local_c0);
    Var::~Var(&local_78);
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::EndModule() {
  // Verify that any ref.func used in init expressions for globals are
  // mentioned in an elems section.  This can't be done while process the
  // globals because the global section comes before the elem section.
  Result result = Result::Ok;
  for (Var func_var : check_declared_funcs_) {
    result |= CheckDeclaredFunc(func_var);
  }
  return result;
}